

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.h
# Opt level: O2

bool __thiscall Memory::RecyclerPageAllocator::IsMemProtectMode(RecyclerPageAllocator *this)

{
  bool bVar1;
  
  bVar1 = Recycler::IsMemProtectMode(this->heapInfo->recycler);
  return bVar1;
}

Assistant:

bgFreePageList(nullptr)
#endif
        {
#if SUPPORT_WIN32_SLIST
            ::InitializeSListHead(&bgFreePageList);
#endif
            DebugOnly(this->isZeroPageQueue = false);
        }